

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall cs::forward_exception::~forward_exception(forward_exception *this)

{
  ~forward_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~forward_exception() override = default;